

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::DistantLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DistantLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  Float a;
  undefined1 auVar2 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar9;
  undefined1 auVar3 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined8 uVar10;
  undefined1 auVar11 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar16;
  Vector3<float> VVar17;
  Vector3f VVar18;
  Point3<float> PVar19;
  SampledSpectrum SVar20;
  Frame wFrame;
  float local_128;
  Tuple2<pbrt::Point2,_float> local_108;
  SampledSpectrum local_100;
  Frame local_f0;
  LightLeSample local_c8;
  undefined8 uVar8;
  undefined1 auVar15 [56];
  
  local_c8.L.values.values[3] = local_c8.L.values.values[1];
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_f0.x.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_f0.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4._0_16_);
  local_f0.x.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  VVar17 = Transform::operator()(&(this->super_LightBase).renderFromLight,&local_f0.x);
  uVar8 = in_register_00001208._0_8_;
  auVar5._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = in_register_00001208;
  local_c8.L.values.values._0_8_ = vmovlps_avx(auVar5._0_16_);
  local_c8.L.values.values[2] = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar17 = Normalize<float>((Vector3<float> *)&local_c8);
  Frame::FromZ(&local_f0,(Vector3f)VVar17.super_Tuple3<pbrt::Vector3,_float>);
  VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
       SampleUniformDiskConcentric((Point2f *)&local_108);
  fVar1 = this->sceneRadius;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  uVar9 = extraout_XMM0_Qb;
  VVar18 = Frame::FromLocal(&local_f0,VVar18);
  auVar3._0_4_ = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar3._4_4_ = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar3._8_4_ = fVar1 * (float)uVar9;
  auVar3._12_4_ = fVar1 * (float)((ulong)uVar9 >> 0x20);
  uVar10 = auVar3._8_8_;
  uVar9 = vmovlps_avx(auVar3);
  local_c8.L.values.values[2] = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8.L.values.values[0] = (float)(int)uVar9;
  local_c8.L.values.values[1] = (float)(int)((ulong)uVar9 >> 0x20);
  PVar19 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_c8);
  fVar1 = this->sceneRadius;
  fVar16 = (float)((ulong)uVar8 >> 0x20);
  auVar12._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  auVar12._8_4_ = -(float)uVar8;
  auVar12._12_4_ = -fVar16;
  auVar15 = ZEXT856(auVar12._8_8_);
  local_128 = -VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  a = this->scale;
  auVar11 = (undefined1  [56])0x0;
  SVar20 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar13._0_8_ = SVar20.values.values._8_8_;
  auVar13._8_56_ = auVar15;
  auVar6._0_8_ = SVar20.values.values._0_8_;
  auVar6._8_56_ = auVar11;
  local_100.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar13._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar20 = SampledSpectrum::operator*(&local_100,a);
  auVar14._0_8_ = SVar20.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar7._0_8_ = SVar20.values.values._0_8_;
  auVar7._8_56_ = auVar11;
  local_c8.L.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
  auVar2._4_4_ = PVar19.super_Tuple3<pbrt::Point3,_float>.y +
                 VVar17.super_Tuple3<pbrt::Vector3,_float>.y * fVar1;
  auVar2._0_4_ = PVar19.super_Tuple3<pbrt::Point3,_float>.x +
                 VVar17.super_Tuple3<pbrt::Vector3,_float>.x * fVar1;
  auVar2._8_4_ = (float)uVar10 + (float)uVar8 * fVar1;
  auVar2._12_4_ = (float)((ulong)uVar10 >> 0x20) + fVar16 * fVar1;
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2);
  local_c8.pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12);
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = local_128;
  local_c8.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_c8.intr.set = false;
  local_c8.pdfDir = 1.0;
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar19.super_Tuple3<pbrt::Point3,_float>.z +
       VVar17.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
  local_c8.ray.time = time;
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_c8);
  pstd::optional<pbrt::Interaction>::~optional(&local_c8.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DistantLight::SampleLe(Point2f u1, Point2f u2,
                                                     SampledWavelengths &lambda,
                                                     Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray, 1 / (Pi * Sqr(sceneRadius)),
                         1);
}